

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case3053(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t in_ECX;
  allocator<char> local_865;
  allocator<char> local_864;
  allocator<char> local_863;
  allocator<char> local_862;
  allocator<char> local_861;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0 [32];
  Expectation local_7c0;
  Expectation local_708;
  Decl local_650;
  Decl local_588;
  Decl local_4c0;
  Decl local_3f8;
  Decl local_330;
  Decl local_268;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"enum x { y , z , w } ;",&local_861);
  Expectation::Expectation(&local_7c0);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"x",&local_862);
  pDVar1 = Decl::Type(&local_1a0,&local_800,EnumDeclaration);
  pDVar1 = Decl::inNameSpace(pDVar1,Tags);
  pDVar1 = Decl::withScopeKind(pDVar1,File);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_7c0,&local_d8);
  Decl::Decl(&local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"y",&local_863);
  pDVar1 = Decl::Member(&local_330,&local_820,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_268,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_268);
  Decl::Decl(&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_840,"z",&local_864);
  pDVar1 = Decl::Member(&local_4c0,&local_840,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_3f8,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_3f8);
  Decl::Decl(&local_650);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"w",&local_865);
  pDVar1 = Decl::Member(&local_650,&local_860,EnumeratorDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_588,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_588);
  Expectation::Expectation(&local_708,pEVar2);
  bind(this,(int)local_7e0,(sockaddr *)&local_708,in_ECX);
  Expectation::~Expectation(&local_708);
  Decl::~Decl(&local_588);
  std::__cxx11::string::~string((string *)&local_860);
  Decl::~Decl(&local_650);
  Decl::~Decl(&local_3f8);
  std::__cxx11::string::~string((string *)&local_840);
  Decl::~Decl(&local_4c0);
  Decl::~Decl(&local_268);
  std::__cxx11::string::~string((string *)&local_820);
  Decl::~Decl(&local_330);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_800);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_7c0);
  std::__cxx11::string::~string(local_7e0);
  return;
}

Assistant:

void DeclarationBinderTester::case3053()
{
    bind("enum x { y , z , w } ;",
         Expectation()
         .declaration(Decl()
                  .Type("x", SymbolKind::EnumDeclaration)
                  .inNameSpace(NameSpace::Tags)
                  .withScopeKind(ScopeKind::File))
         .declaration(Decl()
                  .Member("y", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Member("z", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S))
         .declaration(Decl()
                  .Member("w", SymbolKind::EnumeratorDeclaration)
                  .ty_.Basic(BasicTypeKind::Int_S)));
}